

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::register_custom_layer(Net *this,char *type,layer_creator_func creator)

{
  pointer *pplVar1;
  iterator __position;
  int iVar2;
  layer_registry_entry entry;
  layer_registry_entry local_28;
  
  iVar2 = layer_to_index(type);
  if (iVar2 == -1) {
    iVar2 = custom_layer_to_index(this,type);
    if (iVar2 == -1) {
      __position._M_current =
           (this->custom_layer_registry).
           super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->custom_layer_registry).
          super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_28.name = type;
        local_28.creator = creator;
        std::vector<ncnn::layer_registry_entry,std::allocator<ncnn::layer_registry_entry>>::
        _M_realloc_insert<ncnn::layer_registry_entry_const&>
                  ((vector<ncnn::layer_registry_entry,std::allocator<ncnn::layer_registry_entry>> *)
                   &this->custom_layer_registry,__position,&local_28);
      }
      else {
        (__position._M_current)->name = type;
        (__position._M_current)->creator = creator;
        pplVar1 = &(this->custom_layer_registry).
                   super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pplVar1 = *pplVar1 + 1;
      }
    }
    else {
      register_custom_layer();
    }
    iVar2 = 0;
  }
  else {
    register_custom_layer((Net *)type);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Net::register_custom_layer(const char* type, layer_creator_func creator)
{
    int typeindex = layer_to_index(type);
    if (typeindex != -1)
    {
        NCNN_LOGE("can not register build-in layer type %s", type);
        return -1;
    }

    int custom_index = custom_layer_to_index(type);
    if (custom_index == -1)
    {
        struct layer_registry_entry entry = { type, creator };
        custom_layer_registry.push_back(entry);
    }
    else
    {
        NCNN_LOGE("overwrite existing custom layer type %s", type);
        custom_layer_registry[custom_index].name = type;
        custom_layer_registry[custom_index].creator = creator;
    }

    return 0;
}